

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O1

void __thiscall refc<cg_other>::decrement(refc<cg_other> *this)

{
  int *piVar1;
  cg_other *pcVar2;
  pointer pcVar3;
  
  piVar1 = this->count;
  if (*piVar1 == 1) {
    operator_delete(piVar1);
    pcVar2 = this->ptr;
    if (pcVar2 != (cg_other *)0x0) {
      pcVar3 = (pcVar2->data).
               super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar3 != (pointer)0x0) {
        operator_delete(pcVar3);
      }
      operator_delete(pcVar2);
      return;
    }
  }
  else {
    *piVar1 = *piVar1 + -1;
  }
  return;
}

Assistant:

void decrement() {
        if (*count == 1) {
            delete count;
            delete ptr;
        } else {
            --*count;
        }
    }